

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O0

void __thiscall
QTextHtmlParserNode::applyCssDeclarations
          (QTextHtmlParserNode *this,QList<QCss::Declaration> *declarations,
          QTextDocument *resourceProvider)

{
  QTextLength maxWidth;
  bool bVar1;
  BorderStyle BVar2;
  undefined4 uVar3;
  int iVar4;
  BrushStyle BVar5;
  qsizetype qVar6;
  QFont *pal;
  Value *pVVar7;
  DeclarationData *pDVar8;
  QColor *pQVar9;
  QTextDocumentPrivate *pQVar10;
  QTextFormat *this_00;
  long in_RDX;
  QList<QCss::Declaration> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qreal qVar11;
  QLatin1StringView QVar12;
  qint64 searchKey;
  LineHeightTypes lineHeightType_1;
  qreal lineHeight;
  LineHeightTypes lineHeightType;
  KnownValue identifier;
  Declaration *decl;
  int i;
  Attachment ignoredAttachment;
  Origin ignoredClip;
  Origin ignoredOrigin;
  QBrush bgBrush;
  QString bgImage;
  Repeat ignoredRepeat;
  Alignment ignoredAlignment;
  int adjustment;
  QBrush brush;
  QPen pen_6;
  qreal dashOffset;
  QPen pen_5;
  QList<double> dashes;
  QPen pen_4;
  qreal miterLimit;
  QPen pen_3;
  QPen pen_2;
  QPen pen_1;
  qreal width;
  QPen pen;
  bool ok_1;
  qreal indent;
  QString value;
  bool ok;
  qreal lineHeight_1;
  QString lineHeightTypeName;
  anon_class_8_1_068654c4 getBorderValues;
  QFont f;
  QTextImageFormat imageFormat;
  ValueExtractor extractor;
  Value cssValue;
  BorderStyle tblBorderStyle [4];
  QBrush tblBorderBrush [4];
  qreal tblBorder [4];
  int borders [4];
  QBrush bordersBrush [4];
  Value *in_stack_fffffffffffff988;
  AlignmentFlag flags;
  QBrush *this_01;
  Value *in_stack_fffffffffffff990;
  VerticalAlignment alignment;
  ValueExtractor *this_02;
  undefined4 in_stack_fffffffffffff998;
  QFlagsStorage<QTextFormat::PageBreakFlag> in_stack_fffffffffffff99c;
  undefined4 in_stack_fffffffffffff9a0;
  UnderlineStyle in_stack_fffffffffffff9a4;
  undefined4 in_stack_fffffffffffff9a8;
  FontPropertiesInheritanceBehavior in_stack_fffffffffffff9ac;
  QFont *in_stack_fffffffffffff9b0;
  QTextHtmlParserNode *in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  ValueExtractor *in_stack_fffffffffffff9c8;
  QFont *in_stack_fffffffffffff9d0;
  QString *in_stack_fffffffffffff9d8;
  QString *in_stack_fffffffffffff9e0;
  QTextHtmlParserNode *in_stack_fffffffffffff9e8;
  undefined1 **local_548;
  undefined1 **local_530;
  undefined1 **local_518;
  undefined1 **in_stack_fffffffffffffb10;
  Origin *in_stack_fffffffffffffb18;
  int local_420;
  int local_41c;
  int local_40c;
  undefined1 local_3ec [8];
  undefined4 local_3e4;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  undefined4 local_3bc;
  undefined4 local_3b8;
  int local_3b4;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  undefined8 local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined8 local_350;
  QColor local_348;
  ValueExtractor local_338;
  QColor local_2f0;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_2e0;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_2dc;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_2d8;
  QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4> local_2d4;
  undefined1 local_2d0 [24];
  undefined1 local_2b8 [24];
  undefined1 local_2a0 [24];
  undefined8 local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  byte local_261;
  double local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  QColor local_240;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  QString local_1f0;
  undefined4 local_1d8;
  undefined2 local_1d4;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined2 local_1b4;
  undefined8 local_1a0;
  undefined4 local_198;
  undefined2 local_194;
  undefined1 local_170 [64];
  QVariant local_130;
  QVariant local_110;
  int local_f0 [10];
  QVariant local_c8;
  QVariant local_a8;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_8 = *(undefined1 **)(in_FS_OFFSET + 0x28);
  memset(local_170,0xaa,0x40);
  QPalette::QPalette((QPalette *)in_stack_fffffffffffff988);
  QCss::ValueExtractor::ValueExtractor
            ((ValueExtractor *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
             (QList<QCss::Declaration> *)
             CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
             (QPalette *)in_stack_fffffffffffff990);
  QPalette::~QPalette((QPalette *)in_stack_fffffffffffff990);
  QCss::ValueExtractor::extractBox
            ((ValueExtractor *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
             (int *)in_stack_fffffffffffff9b8,(int *)in_stack_fffffffffffff9b0,
             (int *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
  local_228 = local_170;
  if ((*(int *)(in_RDI + 0x68) == 0x2f) || (*(int *)(in_RDI + 0x68) == 0x30)) {
    applyCssDeclarations::anon_class_8_1_068654c4::operator()
              ((anon_class_8_1_068654c4 *)in_stack_fffffffffffff9d8,
               (qreal *)in_stack_fffffffffffff9d0,(QBrush *)in_stack_fffffffffffff9c8,
               (BorderStyle *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
  }
  for (local_40c = 0; qVar6 = QList<QCss::Declaration>::size(in_RSI), local_40c < qVar6;
      local_40c = local_40c + 1) {
    pal = (QFont *)QList<QCss::Declaration>::at
                             ((QList<QCss::Declaration> *)in_stack_fffffffffffff990,
                              (qsizetype)in_stack_fffffffffffff988);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85bf5f);
    bVar1 = QList<QCss::Value>::isEmpty((QList<QCss::Value> *)0x85bf6b);
    if (!bVar1) {
      local_41c = 0;
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85bf8e);
      pVVar7 = QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
      if (pVVar7->type == KnownIdentifier) {
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85bfac);
        pVVar7 = QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
        local_41c = ::QVariant::toInt((bool *)&pVVar7->variant);
      }
      pDVar8 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0x85bfdc);
      in_stack_fffffffffffffb18 = (Origin *)(ulong)(pDVar8->propertyId - Color);
      switch(in_stack_fffffffffffffb18) {
      case (Origin *)0x0:
        QPalette::QPalette((QPalette *)in_stack_fffffffffffff988);
        local_240 = QCss::Declaration::colorValue
                              ((Declaration *)in_stack_fffffffffffff9d0,
                               (QPalette *)in_stack_fffffffffffff9c8);
        local_1a0 = local_240._0_8_;
        local_198 = local_240.ct._4_4_;
        local_194 = local_240.ct._8_2_;
        QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                       (QColor *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                       (BrushStyle)((ulong)in_stack_fffffffffffff990 >> 0x20));
        QTextFormat::setForeground
                  ((QTextFormat *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                   (QBrush *)in_stack_fffffffffffff990);
        QBrush::~QBrush((QBrush *)0x85c4f1);
        QPalette::~QPalette((QPalette *)in_stack_fffffffffffff990);
        break;
      case (Origin *)0x1:
        *(byte *)(in_RDI + 0x90) = *(byte *)(in_RDI + 0x90) & 0xfc;
        if (local_41c == 0x13) {
          *(ushort *)(in_RDI + 0x90) = *(ushort *)(in_RDI + 0x90) & 0xfffc | 1;
        }
        else if (local_41c == 0x14) {
          *(ushort *)(in_RDI + 0x90) = *(ushort *)(in_RDI + 0x90) & 0xfffc | 2;
        }
        break;
      default:
        break;
      case (Origin *)0xc:
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85c5a7);
        pVVar7 = QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
        ::QVariant::toInt((bool *)&pVVar7->variant);
        QTextBlockFormat::setIndent
                  ((QTextBlockFormat *)
                   CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                   (int)((ulong)in_stack_fffffffffffff990 >> 0x20));
        break;
      case (Origin *)0xd:
        bVar1 = QCss::Declaration::intValue
                          ((Declaration *)
                           CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                           (int *)in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988);
        if (bVar1) {
          *(ushort *)(in_RDI + 0x90) = *(ushort *)(in_RDI + 0x90) & 0xffdf | 0x20;
        }
        break;
      case (Origin *)0xe:
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85cb5f);
        QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
        ::QVariant::toString();
        QVar12 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                            (size_t)in_stack_fffffffffffff990);
        iVar4 = QString::compare((QLatin1String *)local_2a0,(CaseSensitivity)QVar12.m_size);
        QString::~QString((QString *)0x85cbd3);
        if (iVar4 == 0) {
          *(ushort *)(in_RDI + 0x90) = *(ushort *)(in_RDI + 0x90) & 0xffbf | 0x40;
        }
        break;
      case (Origin *)0xf:
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85cc0f);
        QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
        ::QVariant::toString();
        QVar12 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                            (size_t)in_stack_fffffffffffff990);
        iVar4 = QString::compare((QLatin1String *)local_2b8,(CaseSensitivity)QVar12.m_size);
        QString::~QString((QString *)0x85cc83);
        if (iVar4 == 0) {
          *(ushort *)(in_RDI + 0x90) = *(ushort *)(in_RDI + 0x90) & 0xff7f | 0x80;
        }
        else {
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85ccc1);
          QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
          ::QVariant::toString();
          QVar12 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998
                                              ),(size_t)in_stack_fffffffffffff990);
          iVar4 = QString::compare((QLatin1String *)local_2d0,(CaseSensitivity)QVar12.m_size);
          QString::~QString((QString *)0x85cd35);
          if (iVar4 == 0) {
            *(ushort *)(in_RDI + 0x90) = *(ushort *)(in_RDI + 0x90) & 0xff7f | 0x80;
            *(ushort *)(in_RDI + 0x90) = *(ushort *)(in_RDI + 0x90) & 0xfeff | 0x100;
          }
        }
        break;
      case (Origin *)0x10:
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85cd8d);
        pVVar7 = QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
        uVar3 = ::QVariant::toInt((bool *)&pVVar7->variant);
        *(undefined4 *)(in_RDI + 0x1b0) = uVar3;
        break;
      case (Origin *)0x12:
        local_288 = 0;
        bVar1 = QCss::Declaration::realValue
                          ((Declaration *)in_stack_fffffffffffff9b8,
                           (qreal *)in_stack_fffffffffffff9b0,
                           (char *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        if (bVar1) {
          QTextBlockFormat::setTextIndent
                    ((QTextBlockFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                     (qreal)in_stack_fffffffffffff990);
        }
        break;
      case (Origin *)0x13:
        switch(local_41c) {
        case 0x19:
          QTextCharFormat::setUnderlineStyle
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                     in_stack_fffffffffffff9a4);
          break;
        case 0x1a:
          QTextCharFormat::setUnderlineStyle
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                     in_stack_fffffffffffff9a4);
          break;
        case 0x1b:
          QTextCharFormat::setUnderlineStyle
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                     in_stack_fffffffffffff9a4);
          break;
        case 0x1c:
          QTextCharFormat::setUnderlineStyle
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                     in_stack_fffffffffffff9a4);
          break;
        case 0x1d:
          QTextCharFormat::setUnderlineStyle
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                     in_stack_fffffffffffff9a4);
          break;
        default:
          break;
        case 0x23:
          QTextCharFormat::setUnderlineStyle
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                     in_stack_fffffffffffff9a4);
          break;
        case 0x27:
          QTextCharFormat::setUnderlineStyle
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                     in_stack_fffffffffffff9a4);
        }
        break;
      case (Origin *)0x14:
        alignment = (VerticalAlignment)((ulong)in_stack_fffffffffffff990 >> 0x20);
        switch(local_41c) {
        case 0x11:
          QTextCharFormat::setVerticalAlignment
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),alignment);
          break;
        case 0x12:
          QTextCharFormat::setVerticalAlignment
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),alignment);
          break;
        default:
          QTextCharFormat::setVerticalAlignment
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),alignment);
          break;
        case 0x15:
          QTextCharFormat::setVerticalAlignment
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),alignment);
          break;
        case 0x16:
          QTextCharFormat::setVerticalAlignment
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),alignment);
          break;
        case 0x24:
          QTextCharFormat::setVerticalAlignment
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),alignment);
        }
        break;
      case (Origin *)0x15:
        switch(local_41c) {
        case 1:
          *(undefined4 *)(in_RDI + 0x1b8) = 0;
          break;
        case 2:
          *(undefined4 *)(in_RDI + 0x1b8) = 1;
          break;
        case 3:
          *(undefined4 *)(in_RDI + 0x1b8) = 2;
          break;
        case 4:
          *(undefined4 *)(in_RDI + 0x1b8) = 4;
          break;
        case 5:
          *(undefined4 *)(in_RDI + 0x1b8) = 3;
        }
        break;
      case (Origin *)0x18:
        local_58 = (undefined1 *)0xffffffffffffffff;
        local_50 = 0xffffffffffffffff;
        local_48 = 0xffffffffffffffff;
        local_40 = 0xffffffffffffffff;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_530 = &local_78;
        do {
          QBrush::QBrush((QBrush *)in_stack_fffffffffffff990);
          local_530 = local_530 + 1;
        } while (local_530 != &local_58);
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        bVar1 = applyCssDeclarations::anon_class_8_1_068654c4::operator()
                          ((anon_class_8_1_068654c4 *)in_stack_fffffffffffff9d8,
                           (qreal *)in_stack_fffffffffffff9d0,(QBrush *)in_stack_fffffffffffff9c8,
                           (BorderStyle *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
        if (bVar1) {
          *(undefined1 **)(in_RDI + 0x130) = local_58;
          pQVar9 = QBrush::color((QBrush *)0x85c362);
          bVar1 = QColor::isValid(pQVar9);
          if (bVar1) {
            QBrush::operator=((QBrush *)
                              CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                              (QBrush *)in_stack_fffffffffffff990);
          }
          if ((int)local_88 != -1) {
            *(int *)(in_RDI + 0x1a8) = (int)local_88;
          }
        }
        local_548 = &local_58;
        do {
          local_548 = local_548 + -1;
          QBrush::~QBrush((QBrush *)0x85c3e2);
        } while (local_548 != &local_78);
        break;
      case (Origin *)0x1d:
        bVar1 = QCss::Declaration::borderCollapseValue
                          ((Declaration *)
                           CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998));
        *(bool *)(in_RDI + 0x1ac) = bVar1;
        break;
      case (Origin *)0x23:
        if (local_41c == 0x25) {
          local_2d8.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
               (QFlagsStorage<QTextFormat::PageBreakFlag>)
               QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)in_stack_fffffffffffff990);
          QFlags<QTextFormat::PageBreakFlag>::operator&
                    ((QFlags<QTextFormat::PageBreakFlag> *)in_stack_fffffffffffff990,
                     (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
          QTextBlockFormat::setPageBreakPolicy
                    ((QTextBlockFormat *)in_stack_fffffffffffff990,
                     (PageBreakFlags)in_stack_fffffffffffff99c.i);
        }
        else if (local_41c == 0x26) {
          local_2d4.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
               (QFlagsStorage<QTextFormat::PageBreakFlag>)
               QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)in_stack_fffffffffffff990);
          QFlags<QTextFormat::PageBreakFlag>::operator|
                    ((QFlags<QTextFormat::PageBreakFlag> *)in_stack_fffffffffffff990,
                     (PageBreakFlag)((ulong)in_stack_fffffffffffff988 >> 0x20));
          QTextBlockFormat::setPageBreakPolicy
                    ((QTextBlockFormat *)in_stack_fffffffffffff990,
                     (PageBreakFlags)in_stack_fffffffffffff99c.i);
        }
        break;
      case (Origin *)0x24:
        if (local_41c == 0x25) {
          local_2e0.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
               (QFlagsStorage<QTextFormat::PageBreakFlag>)
               QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)in_stack_fffffffffffff990);
          QFlags<QTextFormat::PageBreakFlag>::operator&
                    ((QFlags<QTextFormat::PageBreakFlag> *)in_stack_fffffffffffff990,
                     (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
          QTextBlockFormat::setPageBreakPolicy
                    ((QTextBlockFormat *)in_stack_fffffffffffff990,
                     (PageBreakFlags)in_stack_fffffffffffff99c.i);
        }
        else if (local_41c == 0x26) {
          local_2dc.super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
               (QFlagsStorage<QTextFormat::PageBreakFlag>)
               QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)in_stack_fffffffffffff990);
          QFlags<QTextFormat::PageBreakFlag>::operator|
                    ((QFlags<QTextFormat::PageBreakFlag> *)in_stack_fffffffffffff990,
                     (PageBreakFlag)((ulong)in_stack_fffffffffffff988 >> 0x20));
          QTextBlockFormat::setPageBreakPolicy
                    ((QTextBlockFormat *)in_stack_fffffffffffff990,
                     (PageBreakFlags)in_stack_fffffffffffff99c.i);
        }
        break;
      case (Origin *)0x2a:
        BVar2 = QCss::Declaration::styleValue((Declaration *)in_stack_fffffffffffff988);
        if ((BVar2 != BorderStyle_Unknown) &&
           (BVar2 = QCss::Declaration::styleValue((Declaration *)in_stack_fffffffffffff988),
           BVar2 != BorderStyle_Native)) {
          BVar2 = QCss::Declaration::styleValue((Declaration *)in_stack_fffffffffffff988);
          *(BorderStyle *)(in_RDI + 0x1a8) = BVar2 - BorderStyle_None;
        }
        break;
      case (Origin *)0x2f:
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffffb10 = &local_28;
        do {
          QBrush::QBrush((QBrush *)in_stack_fffffffffffff990);
          in_stack_fffffffffffffb10 = in_stack_fffffffffffffb10 + 1;
        } while (in_stack_fffffffffffffb10 != &local_8);
        QPalette::QPalette((QPalette *)in_stack_fffffffffffff988);
        QCss::Declaration::brushValues
                  ((Declaration *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                   (QBrush *)in_stack_fffffffffffff9b8,(QPalette *)in_stack_fffffffffffff9b0);
        QPalette::~QPalette((QPalette *)in_stack_fffffffffffff990);
        pQVar9 = QBrush::color((QBrush *)0x85c103);
        bVar1 = QColor::isValid(pQVar9);
        if (bVar1) {
          QBrush::operator=((QBrush *)
                            CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                            (QBrush *)in_stack_fffffffffffff990);
        }
        local_518 = &local_8;
        do {
          local_518 = local_518 + -1;
          QBrush::~QBrush((QBrush *)0x85c162);
        } while (local_518 != &local_28);
        break;
      case (Origin *)0x34:
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        QCss::ValueExtractor::lengthValues
                  ((ValueExtractor *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                   (Declaration *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                   (int *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998));
        *(double *)(in_RDI + 0x130) = (double)(int)local_38;
        break;
      case (Origin *)0x47:
        if (*(int *)(in_RDI + 0x68) == 0x1d) {
          local_210 = &DAT_aaaaaaaaaaaaaaaa;
          local_208 = &DAT_aaaaaaaaaaaaaaaa;
          QTextFormat::toImageFormat((QTextFormat *)in_stack_fffffffffffff988);
          QCss::ValueExtractor::textLength
                    ((ValueExtractor *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                     ,(Declaration *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
          maxWidth._4_4_ = in_stack_fffffffffffff9a4;
          maxWidth.lengthType = in_stack_fffffffffffff9a0;
          maxWidth.fixedValueOrPercentage._0_4_ = in_stack_fffffffffffff9a8;
          maxWidth.fixedValueOrPercentage._4_4_ = in_stack_fffffffffffff9ac;
          QTextImageFormat::setMaximumWidth
                    ((QTextImageFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),maxWidth);
          QTextCharFormat::operator=
                    ((QTextCharFormat *)in_stack_fffffffffffff990,
                     (QTextCharFormat *)in_stack_fffffffffffff988);
          QTextImageFormat::~QTextImageFormat((QTextImageFormat *)0x85db01);
        }
        break;
      case (Origin *)0x53:
      case (Origin *)0x54:
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85d287);
        setListStyle(in_stack_fffffffffffff9b8,(QList<QCss::Value> *)in_stack_fffffffffffff9b0);
        break;
      case (Origin *)0x56:
        flags = (AlignmentFlag)((ulong)in_stack_fffffffffffff988 >> 0x20);
        if (local_41c == 0x13) {
          QFlags<Qt::AlignmentFlag>::QFlags
                    ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff990,flags);
          QTextBlockFormat::setAlignment
                    ((QTextBlockFormat *)in_stack_fffffffffffff990,
                     (Alignment)in_stack_fffffffffffff99c.i);
        }
        else if (local_41c == 0x14) {
          in_stack_fffffffffffff9e0 = (QString *)(in_RDI + 0x80);
          QFlags<Qt::AlignmentFlag>::QFlags
                    ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff990,flags);
          QTextBlockFormat::setAlignment
                    ((QTextBlockFormat *)in_stack_fffffffffffff990,
                     (Alignment)in_stack_fffffffffffff99c.i);
        }
        else if (local_41c == 0x17) {
          in_stack_fffffffffffff9e8 = (QTextHtmlParserNode *)(in_RDI + 0x80);
          QFlags<Qt::AlignmentFlag>::QFlags
                    ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffff990,flags);
          QTextBlockFormat::setAlignment
                    ((QTextBlockFormat *)in_stack_fffffffffffff990,
                     (Alignment)in_stack_fffffffffffff99c.i);
        }
        break;
      case (Origin *)0x63:
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85d2ad);
        QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
        ::QVariant::toString();
        QString::operator=((QString *)in_stack_fffffffffffff990,(QString *)in_stack_fffffffffffff988
                          );
        QString::~QString((QString *)0x85d2f6);
        break;
      case (Origin *)0x64:
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85d308);
        QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
        ::QVariant::toString();
        QString::operator=((QString *)in_stack_fffffffffffff990,(QString *)in_stack_fffffffffffff988
                          );
        QString::~QString((QString *)0x85d351);
        break;
      case (Origin *)0x65:
        local_260 = -NAN;
        bVar1 = QCss::Declaration::realValue
                          ((Declaration *)in_stack_fffffffffffff9b8,
                           (qreal *)in_stack_fffffffffffff9b0,
                           (char *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        if (!bVar1) {
          local_261 = 0xaa;
          memset(local_f0,0xaa,0x28);
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85c931);
          QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
          QCss::Value::Value(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
          local_280 = &DAT_aaaaaaaaaaaaaaaa;
          local_278 = &DAT_aaaaaaaaaaaaaaaa;
          local_270 = &DAT_aaaaaaaaaaaaaaaa;
          QCss::Value::toString
                    ((Value *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
          local_260 = (double)QString::toDouble((bool *)&local_280);
          if ((local_261 & 1) == 0) {
            local_260 = 0.0;
          }
          else if (((*(ushort *)(in_RDI + 0x90) >> 3 & 1) == 0) && (local_f0[0] == 1)) {
            local_260 = local_260 * 100.0;
            *(ushort *)(in_RDI + 0x90) = *(ushort *)(in_RDI + 0x90) & 0xffef | 0x10;
          }
          QString::~QString((QString *)0x85ca49);
          QCss::Value::~Value((Value *)0x85ca56);
        }
        if ((*(ushort *)(in_RDI + 0x90) >> 3 & 1) != 0) {
          QTextBlockFormat::lineHeightType((QTextBlockFormat *)0x85ca89);
        }
        QTextBlockFormat::setLineHeight
                  ((QTextBlockFormat *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                   ,(qreal)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                   in_stack_fffffffffffff99c.i);
        break;
      case (Origin *)0x66:
        local_258 = &DAT_aaaaaaaaaaaaaaaa;
        local_250 = &DAT_aaaaaaaaaaaaaaaa;
        local_248 = &DAT_aaaaaaaaaaaaaaaa;
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85c611);
        QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
        ::QVariant::toString();
        QVar12 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                            (size_t)in_stack_fffffffffffff990);
        iVar4 = QString::compare((QLatin1String *)&local_258,(CaseSensitivity)QVar12.m_size);
        if (iVar4 == 0) {
          local_420 = 1;
        }
        else {
          QVar12 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998
                                              ),(size_t)in_stack_fffffffffffff990);
          iVar4 = QString::compare((QLatin1String *)&local_258,(CaseSensitivity)QVar12.m_size);
          if (iVar4 == 0) {
            local_420 = 2;
          }
          else {
            QVar12 = Qt::Literals::StringLiterals::operator____L1
                               ((char *)CONCAT44(in_stack_fffffffffffff99c.i,
                                                 in_stack_fffffffffffff998),
                                (size_t)in_stack_fffffffffffff990);
            iVar4 = QString::compare((QLatin1String *)&local_258,(CaseSensitivity)QVar12.m_size);
            if (iVar4 == 0) {
              local_420 = 3;
            }
            else {
              QVar12 = Qt::Literals::StringLiterals::operator____L1
                                 ((char *)CONCAT44(in_stack_fffffffffffff99c.i,
                                                   in_stack_fffffffffffff998),
                                  (size_t)in_stack_fffffffffffff990);
              iVar4 = QString::compare((QLatin1String *)&local_258,(CaseSensitivity)QVar12.m_size);
              if (iVar4 == 0) {
                local_420 = 4;
              }
              else {
                local_420 = 0;
              }
            }
          }
        }
        if ((*(ushort *)(in_RDI + 0x90) >> 4 & 1) != 0) {
          qVar11 = QTextBlockFormat::lineHeight((QTextBlockFormat *)0x85c7ce);
          ::QVariant::QVariant(&local_a8,qVar11 / 100.0);
          QTextFormat::setProperty
                    ((QTextFormat *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     in_stack_fffffffffffff99c.i,(QVariant *)in_stack_fffffffffffff990);
          ::QVariant::~QVariant(&local_a8);
        }
        ::QVariant::QVariant(&local_c8,local_420);
        QTextFormat::setProperty
                  ((QTextFormat *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                   in_stack_fffffffffffff99c.i,(QVariant *)in_stack_fffffffffffff990);
        ::QVariant::~QVariant(&local_c8);
        *(ushort *)(in_RDI + 0x90) = *(ushort *)(in_RDI + 0x90) & 0xfff7 | 8;
        QString::~QString((QString *)0x85c8b2);
        break;
      case (Origin *)0x68:
        if ((in_RDX != 0) &&
           (pQVar10 = QTextDocumentPrivate::get((QTextDocument *)0x85d44c),
           pQVar10 != (QTextDocumentPrivate *)0x0)) {
          local_338.declarations.d.ptr._3_1_ = 0xaa;
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x85d467);
          pVVar7 = QList<QCss::Value>::constFirst((QList<QCss::Value> *)in_stack_fffffffffffff990);
          ::QVariant::toLongLong((bool *)&pVVar7->variant);
          if ((local_338.declarations.d.ptr._3_1_ & 1) != 0) {
            applyForegroundImage
                      (in_stack_fffffffffffff9e8,(qint64)in_stack_fffffffffffff9e0,
                       (QTextDocument *)in_stack_fffffffffffff9d8);
          }
        }
        break;
      case (Origin *)0x6c:
        QPalette::QPalette((QPalette *)in_stack_fffffffffffff988);
        local_2f0 = QCss::Declaration::colorValue
                              ((Declaration *)in_stack_fffffffffffff9d0,
                               (QPalette *)in_stack_fffffffffffff9c8);
        local_1c0 = local_2f0._0_8_;
        local_1b8 = local_2f0.ct._4_4_;
        local_1b4 = local_2f0.ct._8_2_;
        QTextCharFormat::setUnderlineColor
                  ((QTextCharFormat *)
                   CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                   (QColor *)in_stack_fffffffffffff990);
        QPalette::~QPalette((QPalette *)in_stack_fffffffffffff990);
        break;
      case (Origin *)0x6f:
        local_350 = 0xffffffffffffffff;
        bVar1 = QCss::Declaration::realValue
                          ((Declaration *)in_stack_fffffffffffff9b8,
                           (qreal *)in_stack_fffffffffffff9b0,
                           (char *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        if (bVar1) {
          local_358 = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::textOutline((QTextCharFormat *)in_stack_fffffffffffff988);
          QPen::setWidthF((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                          (qreal)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998));
          QTextCharFormat::setTextOutline
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                     (QPen *)in_stack_fffffffffffff990);
          QPen::~QPen((QPen *)0x85d64c);
        }
        break;
      case (Origin *)0x70:
        local_338.declarations.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffff9c8 = &local_338;
        QTextCharFormat::textOutline((QTextCharFormat *)in_stack_fffffffffffff988);
        QPen::setStyle((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                       in_stack_fffffffffffff99c.i);
        in_stack_fffffffffffff9d8 = &local_1f0;
        QPalette::QPalette((QPalette *)in_stack_fffffffffffff988);
        local_348 = QCss::Declaration::colorValue
                              ((Declaration *)pal,(QPalette *)in_stack_fffffffffffff9c8);
        local_1f0.d.size = local_348._0_8_;
        local_1d8 = local_348.ct._4_4_;
        local_1d4 = local_348.ct._8_2_;
        QPen::setColor((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                       (QColor *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998));
        QPalette::~QPalette((QPalette *)in_stack_fffffffffffff990);
        QTextCharFormat::setTextOutline
                  ((QTextCharFormat *)
                   CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                   (QPen *)in_stack_fffffffffffff990);
        QPen::~QPen((QPen *)0x85d5b0);
        in_stack_fffffffffffff9d0 = pal;
        break;
      case (Origin *)0x71:
        local_360 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCharFormat::textOutline((QTextCharFormat *)in_stack_fffffffffffff988);
        if (local_41c == 0x34) {
          QPen::setCapStyle((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                            in_stack_fffffffffffff99c.i);
        }
        else if (local_41c == 0x35) {
          QPen::setCapStyle((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                            in_stack_fffffffffffff99c.i);
        }
        else if (local_41c == 0x36) {
          QPen::setCapStyle((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                            in_stack_fffffffffffff99c.i);
        }
        QTextCharFormat::setTextOutline
                  ((QTextCharFormat *)
                   CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                   (QPen *)in_stack_fffffffffffff990);
        QPen::~QPen((QPen *)0x85d705);
        in_stack_fffffffffffff9c4 = local_41c;
        break;
      case (Origin *)0x72:
        local_368 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCharFormat::textOutline((QTextCharFormat *)in_stack_fffffffffffff988);
        in_stack_fffffffffffff9b8 = (QTextHtmlParserNode *)(ulong)(local_41c - 0x37);
        switch(in_stack_fffffffffffff9b8) {
        case (QTextHtmlParserNode *)0x0:
          QPen::setJoinStyle((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                             in_stack_fffffffffffff99c.i);
          break;
        case (QTextHtmlParserNode *)0x1:
          QPen::setJoinStyle((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                             in_stack_fffffffffffff99c.i);
          break;
        case (QTextHtmlParserNode *)0x2:
          QPen::setJoinStyle((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                             in_stack_fffffffffffff99c.i);
          break;
        case (QTextHtmlParserNode *)0x3:
          QPen::setJoinStyle((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                             in_stack_fffffffffffff99c.i);
        }
        QTextCharFormat::setTextOutline
                  ((QTextCharFormat *)
                   CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                   (QPen *)in_stack_fffffffffffff990);
        QPen::~QPen((QPen *)0x85d7d6);
        break;
      case (Origin *)0x73:
        local_370 = 0xffffffffffffffff;
        bVar1 = QCss::Declaration::realValue
                          ((Declaration *)in_stack_fffffffffffff9b8,
                           (qreal *)in_stack_fffffffffffff9b0,
                           (char *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        if (bVar1) {
          local_378 = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::textOutline((QTextCharFormat *)in_stack_fffffffffffff988);
          QPen::setMiterLimit((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                              (qreal)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998)
                             );
          QTextCharFormat::setTextOutline
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                     (QPen *)in_stack_fffffffffffff990);
          QPen::~QPen((QPen *)0x85d86f);
        }
        break;
      case (Origin *)0x74:
        local_390 = &DAT_aaaaaaaaaaaaaaaa;
        local_388 = &DAT_aaaaaaaaaaaaaaaa;
        local_380 = &DAT_aaaaaaaaaaaaaaaa;
        QCss::Declaration::dashArray((Declaration *)in_stack_fffffffffffff9b8);
        bVar1 = QList<double>::empty((QList<double> *)0x85d8c3);
        if (!bVar1) {
          local_398 = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::textOutline((QTextCharFormat *)in_stack_fffffffffffff988);
          QPen::setDashPattern
                    ((QPen *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                     (QList<double> *)in_stack_fffffffffffff990);
          QTextCharFormat::setTextOutline
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                     (QPen *)in_stack_fffffffffffff990);
          QPen::~QPen((QPen *)0x85d92a);
        }
        QList<double>::~QList((QList<double> *)0x85d937);
        break;
      case (Origin *)0x75:
        local_3a0 = 0xffffffffffffffff;
        bVar1 = QCss::Declaration::realValue
                          ((Declaration *)in_stack_fffffffffffff9b8,
                           (qreal *)in_stack_fffffffffffff9b0,
                           (char *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        if (bVar1) {
          local_3a8 = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::textOutline((QTextCharFormat *)in_stack_fffffffffffff988);
          QPen::setDashOffset((QPen *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                              (qreal)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998)
                             );
          QTextCharFormat::setTextOutline
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                     (QPen *)in_stack_fffffffffffff990);
          QPen::~QPen((QPen *)0x85d9d0);
        }
        break;
      case (Origin *)0x76:
        local_3b0 = &DAT_aaaaaaaaaaaaaaaa;
        QPalette::QPalette((QPalette *)in_stack_fffffffffffff988);
        QCss::Declaration::brushValue((Declaration *)in_stack_fffffffffffff9b8,(QPalette *)pal);
        QPalette::~QPalette((QPalette *)in_stack_fffffffffffff990);
        QTextFormat::setForeground
                  ((QTextFormat *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                   (QBrush *)in_stack_fffffffffffff990);
        QBrush::~QBrush((QBrush *)0x85da4b);
        in_stack_fffffffffffff9b0 = pal;
      }
    }
  }
  local_220 = &DAT_aaaaaaaaaaaaaaaa;
  local_218 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
  local_3b4 = -0xff;
  QCss::ValueExtractor::extractFont
            (in_stack_fffffffffffff9c8,
             (QFont *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
             (int *)in_stack_fffffffffffff9b8);
  iVar4 = QFont::pixelSize((QFont *)0x85db7d);
  if (0x3fffffff < iVar4) {
    QFont::setPixelSize((QFont *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                        (int)((ulong)in_stack_fffffffffffff990 >> 0x20));
  }
  QTextCharFormat::setFont
            ((QTextCharFormat *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
             in_stack_fffffffffffff9ac);
  if (-2 < local_3b4) {
    ::QVariant::QVariant(&local_110,local_3b4);
    QTextFormat::setProperty
              ((QTextFormat *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff99c.i,(QVariant *)in_stack_fffffffffffff990);
    ::QVariant::~QVariant(&local_110);
  }
  local_3b8 = 0xaaaaaaaa;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x85dc1e);
  local_3bc = 0xaaaaaaaa;
  local_3d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_3d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_3c8 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x85dc63);
  local_3e0 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)in_stack_fffffffffffff990);
  local_3e4 = 0xaaaaaaaa;
  local_3ec._4_4_ = 0xaaaaaaaa;
  local_3ec._0_4_ = 0xaaaaaaaa;
  this_01 = (QBrush *)local_3ec;
  this_02 = (ValueExtractor *)(local_3ec + 4);
  QCss::ValueExtractor::extractBackground
            ((ValueExtractor *)in_stack_fffffffffffff9e8,(QBrush *)in_stack_fffffffffffff9e0,
             in_stack_fffffffffffff9d8,(Repeat *)in_stack_fffffffffffff9d0,
             (Alignment *)in_stack_fffffffffffff9c8,
             (Origin *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
             (Attachment *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb18);
  bVar1 = QString::isEmpty((QString *)0x85dcfb);
  if ((bVar1) || (in_RDX == 0)) {
    BVar5 = QBrush::style((QBrush *)0x85dd39);
    if ((BVar5 != NoBrush) &&
       (QTextFormat::setBackground
                  ((QTextFormat *)CONCAT44(in_stack_fffffffffffff99c.i,in_stack_fffffffffffff998),
                   (QBrush *)this_02), *(int *)(in_RDI + 0x68) == 0x1f)) {
      this_00 = (QTextFormat *)(in_RDI + 0x80);
      QBrush::operator_cast_to_QVariant(this_01);
      QTextFormat::setProperty(this_00,in_stack_fffffffffffff99c.i,(QVariant *)this_02);
      ::QVariant::~QVariant(&local_130);
    }
  }
  else {
    applyBackgroundImage
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
               (QTextDocument *)in_stack_fffffffffffff9d8);
  }
  QBrush::~QBrush((QBrush *)0x85ddc2);
  QString::~QString((QString *)0x85ddcf);
  QFont::~QFont((QFont *)0x85dddc);
  QCss::ValueExtractor::~ValueExtractor(this_02);
  if (*(undefined1 **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParserNode::applyCssDeclarations(const QList<QCss::Declaration> &declarations, const QTextDocument *resourceProvider)
{
    QCss::ValueExtractor extractor(declarations);
    extractor.extractBox(margin, padding);

    auto getBorderValues = [&extractor](qreal *borderWidth, QBrush *borderBrush, QTextFrameFormat::BorderStyle *borderStyles) {
        QCss::BorderStyle cssStyles[4];
        int cssBorder[4];
        QSize cssRadii[4]; // unused
        for (int i = 0; i < 4; ++i) {
            cssStyles[i] = QCss::BorderStyle_None;
            cssBorder[i] = 0;
        }
        // this will parse (and cache) "border-width" as a list so the
        // QCss::BorderWidth parsing below which expects a single value
        // will not work as expected - which in this case does not matter
        // because tableBorder is not relevant for cells.
        bool hit = extractor.extractBorder(cssBorder, borderBrush, cssStyles, cssRadii);
        for (int i = 0; i < 4; ++i) {
            borderStyles[i] = toQTextFrameFormat(cssStyles[i]);
            borderWidth[i] = static_cast<qreal>(cssBorder[i]);
        }
        return hit;
    };

    if (id == Html_td || id == Html_th)
        getBorderValues(tableCellBorder, tableCellBorderBrush, tableCellBorderStyle);

    for (int i = 0; i < declarations.size(); ++i) {
        const QCss::Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty()) continue;

        QCss::KnownValue identifier = QCss::UnknownValue;
        if (decl.d->values.constFirst().type == QCss::Value::KnownIdentifier)
            identifier = static_cast<QCss::KnownValue>(decl.d->values.constFirst().variant.toInt());

        switch (decl.d->propertyId) {
        case QCss::BorderColor: {
            QBrush bordersBrush[4];
            decl.brushValues(bordersBrush);
            if (bordersBrush[0].color().isValid())
                borderBrush = bordersBrush[0];
            break;
        }
        case QCss::BorderStyles:
            if (decl.styleValue() != QCss::BorderStyle_Unknown && decl.styleValue() != QCss::BorderStyle_Native)
                borderStyle = static_cast<QTextFrameFormat::BorderStyle>(decl.styleValue() - 1);
            break;
        case QCss::BorderWidth: {
            int borders[4];
            extractor.lengthValues(decl, borders);
            tableBorder = borders[0];
            }
            break;
        case QCss::Border: {
            qreal tblBorder[4];
            QBrush tblBorderBrush[4];
            QTextFrameFormat::BorderStyle tblBorderStyle[4];
            if (getBorderValues(tblBorder, tblBorderBrush, tblBorderStyle)) {
                tableBorder = tblBorder[0];
                if (tblBorderBrush[0].color().isValid())
                    borderBrush = tblBorderBrush[0];
                if (tblBorderStyle[0] != static_cast<QTextFrameFormat::BorderStyle>(-1))
                    borderStyle = tblBorderStyle[0];
            }
        }
        break;
        case QCss::BorderCollapse:
            borderCollapse = decl.borderCollapseValue();
            break;
        case QCss::Color: charFormat.setForeground(decl.colorValue()); break;
        case QCss::Float:
            cssFloat = QTextFrameFormat::InFlow;
            switch (identifier) {
            case QCss::Value_Left: cssFloat = QTextFrameFormat::FloatLeft; break;
            case QCss::Value_Right: cssFloat = QTextFrameFormat::FloatRight; break;
            default: break;
            }
            break;
        case QCss::QtBlockIndent:
            blockFormat.setIndent(decl.d->values.constFirst().variant.toInt());
            break;
        case QCss::QtLineHeightType: {
            QString lineHeightTypeName = decl.d->values.constFirst().variant.toString();
            QTextBlockFormat::LineHeightTypes lineHeightType;
            if (lineHeightTypeName.compare("proportional"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::ProportionalHeight;
            else if (lineHeightTypeName.compare("fixed"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::FixedHeight;
            else if (lineHeightTypeName.compare("minimum"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::MinimumHeight;
            else if (lineHeightTypeName.compare("line-distance"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::LineDistanceHeight;
            else
                lineHeightType = QTextBlockFormat::SingleHeight;

            if (hasLineHeightMultiplier) {
                qreal lineHeight = blockFormat.lineHeight() / 100.0;
                blockFormat.setProperty(QTextBlockFormat::LineHeight, lineHeight);
            }

            blockFormat.setProperty(QTextBlockFormat::LineHeightType, lineHeightType);
            hasOwnLineHeightType = true;
        }
        break;
        case QCss::LineHeight: {
            qreal lineHeight;
            QTextBlockFormat::LineHeightTypes lineHeightType;
            if (decl.realValue(&lineHeight, "px")) {
                lineHeightType = QTextBlockFormat::MinimumHeight;
            } else {
                bool ok;
                QCss::Value cssValue = decl.d->values.constFirst();
                QString value = cssValue.toString();
                lineHeight = value.toDouble(&ok);
                if (ok) {
                    if (!hasOwnLineHeightType && cssValue.type == QCss::Value::Number) {
                        lineHeight *= 100.0;
                        hasLineHeightMultiplier = true;
                    }
                    lineHeightType = QTextBlockFormat::ProportionalHeight;
                } else {
                    lineHeight = 0.0;
                    lineHeightType = QTextBlockFormat::SingleHeight;
                }
            }

            // Only override line height type if specified in same node
            if (hasOwnLineHeightType)
                lineHeightType = QTextBlockFormat::LineHeightTypes(blockFormat.lineHeightType());

            blockFormat.setLineHeight(lineHeight, lineHeightType);
            break;
        }
        case QCss::TextIndent: {
            qreal indent = 0;
            if (decl.realValue(&indent, "px"))
                blockFormat.setTextIndent(indent);
            break; }
        case QCss::QtListIndent:
            if (decl.intValue(&cssListIndent))
                hasCssListIndent = true;
            break;
        case QCss::QtParagraphType:
            if (decl.d->values.constFirst().variant.toString().compare("empty"_L1, Qt::CaseInsensitive) == 0)
                isEmptyParagraph = true;
            break;
        case QCss::QtTableType:
            if (decl.d->values.constFirst().variant.toString().compare("frame"_L1, Qt::CaseInsensitive) == 0)
                isTextFrame = true;
            else if (decl.d->values.constFirst().variant.toString().compare("root"_L1, Qt::CaseInsensitive) == 0) {
                isTextFrame = true;
                isRootFrame = true;
            }
            break;
        case QCss::QtUserState:
            userState = decl.d->values.constFirst().variant.toInt();
            break;
        case QCss::Whitespace:
            switch (identifier) {
            case QCss::Value_Normal: wsm = QTextHtmlParserNode::WhiteSpaceNormal; break;
            case QCss::Value_Pre: wsm = QTextHtmlParserNode::WhiteSpacePre; break;
            case QCss::Value_NoWrap: wsm = QTextHtmlParserNode::WhiteSpaceNoWrap; break;
            case QCss::Value_PreWrap: wsm = QTextHtmlParserNode::WhiteSpacePreWrap; break;
            case QCss::Value_PreLine: wsm = QTextHtmlParserNode::WhiteSpacePreLine; break;
            default: break;
            }
            break;
        case QCss::VerticalAlignment:
            switch (identifier) {
            case QCss::Value_Sub: charFormat.setVerticalAlignment(QTextCharFormat::AlignSubScript); break;
            case QCss::Value_Super: charFormat.setVerticalAlignment(QTextCharFormat::AlignSuperScript); break;
            case QCss::Value_Middle: charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle); break;
            case QCss::Value_Top: charFormat.setVerticalAlignment(QTextCharFormat::AlignTop); break;
            case QCss::Value_Bottom: charFormat.setVerticalAlignment(QTextCharFormat::AlignBottom); break;
            default: charFormat.setVerticalAlignment(QTextCharFormat::AlignNormal); break;
            }
            break;
        case QCss::PageBreakBefore:
            switch (identifier) {
            case QCss::Value_Always: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() | QTextFormat::PageBreak_AlwaysBefore); break;
            case QCss::Value_Auto: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() & ~QTextFormat::PageBreak_AlwaysBefore); break;
            default: break;
            }
            break;
        case QCss::PageBreakAfter:
            switch (identifier) {
            case QCss::Value_Always: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() | QTextFormat::PageBreak_AlwaysAfter); break;
            case QCss::Value_Auto: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() & ~QTextFormat::PageBreak_AlwaysAfter); break;
            default: break;
            }
            break;
        case QCss::TextUnderlineStyle:
            switch (identifier) {
            case QCss::Value_None: charFormat.setUnderlineStyle(QTextCharFormat::NoUnderline); break;
            case QCss::Value_Solid: charFormat.setUnderlineStyle(QTextCharFormat::SingleUnderline); break;
            case QCss::Value_Dashed: charFormat.setUnderlineStyle(QTextCharFormat::DashUnderline); break;
            case QCss::Value_Dotted: charFormat.setUnderlineStyle(QTextCharFormat::DotLine); break;
            case QCss::Value_DotDash: charFormat.setUnderlineStyle(QTextCharFormat::DashDotLine); break;
            case QCss::Value_DotDotDash: charFormat.setUnderlineStyle(QTextCharFormat::DashDotDotLine); break;
            case QCss::Value_Wave: charFormat.setUnderlineStyle(QTextCharFormat::WaveUnderline); break;
            default: break;
            }
            break;
        case QCss::TextDecorationColor: charFormat.setUnderlineColor(decl.colorValue()); break;
        case QCss::ListStyleType:
        case QCss::ListStyle:
            setListStyle(decl.d->values);
            break;
        case QCss::QtListNumberPrefix:
            textListNumberPrefix = decl.d->values.constFirst().variant.toString();
            break;
        case QCss::QtListNumberSuffix:
            textListNumberSuffix = decl.d->values.constFirst().variant.toString();
            break;
        case QCss::TextAlignment:
            switch (identifier) {
            case QCss::Value_Left: blockFormat.setAlignment(Qt::AlignLeft); break;
            case QCss::Value_Center: blockFormat.setAlignment(Qt::AlignCenter); break;
            case QCss::Value_Right: blockFormat.setAlignment(Qt::AlignRight); break;
            default: break;
            }
            break;

        case QCss::QtForegroundTextureCacheKey:
        {
            if (resourceProvider != nullptr && QTextDocumentPrivate::get(resourceProvider) != nullptr) {
                bool ok;
                qint64 searchKey = decl.d->values.constFirst().variant.toLongLong(&ok);
                if (ok)
                    applyForegroundImage(searchKey, resourceProvider);
            }
            break;
        }
        case QCss::QtStrokeColor:
        {
            QPen pen = charFormat.textOutline();
            pen.setStyle(Qt::SolidLine);
            pen.setColor(decl.colorValue());
            charFormat.setTextOutline(pen);
            break;
        }
        case QCss::QtStrokeWidth:
        {
            qreal width;
            if (decl.realValue(&width, "px")) {
                QPen pen = charFormat.textOutline();
                pen.setWidthF(width);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtStrokeLineCap:
        {
            QPen pen = charFormat.textOutline();
            switch (identifier) {
            case QCss::Value_SquareCap: pen.setCapStyle(Qt::SquareCap); break;
            case QCss::Value_FlatCap: pen.setCapStyle(Qt::FlatCap); break;
            case QCss::Value_RoundCap: pen.setCapStyle(Qt::RoundCap); break;
            default: break;
            }
            charFormat.setTextOutline(pen);
            break;
        }
        case QCss::QtStrokeLineJoin:
        {
            QPen pen = charFormat.textOutline();
            switch (identifier) {
            case QCss::Value_MiterJoin: pen.setJoinStyle(Qt::MiterJoin); break;
            case QCss::Value_BevelJoin: pen.setJoinStyle(Qt::BevelJoin); break;
            case QCss::Value_RoundJoin: pen.setJoinStyle(Qt::RoundJoin); break;
            case QCss::Value_SvgMiterJoin: pen.setJoinStyle(Qt::SvgMiterJoin); break;
            default: break;
            }
            charFormat.setTextOutline(pen);
            break;
        }
        case QCss::QtStrokeMiterLimit:
        {
            qreal miterLimit;
            if (decl.realValue(&miterLimit)) {
                QPen pen = charFormat.textOutline();
                pen.setMiterLimit(miterLimit);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtStrokeDashArray:
        {
            QList<qreal> dashes = decl.dashArray();
            if (!dashes.empty()) {
                QPen pen = charFormat.textOutline();
                pen.setDashPattern(dashes);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtStrokeDashOffset:
        {
            qreal dashOffset;
            if (decl.realValue(&dashOffset)) {
                QPen pen = charFormat.textOutline();
                pen.setDashOffset(dashOffset);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtForeground:
        {
            QBrush brush = decl.brushValue();
            charFormat.setForeground(brush);
            break;
        }
        case QCss::MaximumWidth:
            if (id == Html_img) {
                auto imageFormat = charFormat.toImageFormat();
                imageFormat.setMaximumWidth(extractor.textLength(decl));
                charFormat = imageFormat;
            }
            break;
        default: break;
        }
    }

    QFont f;
    int adjustment = -255;
    extractor.extractFont(&f, &adjustment);
    if (f.pixelSize() > INT32_MAX / 2)
        f.setPixelSize(INT32_MAX / 2);   // avoid even more extreme values
    charFormat.setFont(f, QTextCharFormat::FontPropertiesSpecifiedOnly);

    if (adjustment >= -1)
        charFormat.setProperty(QTextFormat::FontSizeAdjustment, adjustment);

    {
        Qt::Alignment ignoredAlignment;
        QCss::Repeat ignoredRepeat;
        QString bgImage;
        QBrush bgBrush;
        QCss::Origin ignoredOrigin, ignoredClip;
        QCss::Attachment ignoredAttachment;
        extractor.extractBackground(&bgBrush, &bgImage, &ignoredRepeat, &ignoredAlignment,
                                    &ignoredOrigin, &ignoredAttachment, &ignoredClip);

        if (!bgImage.isEmpty() && resourceProvider) {
            applyBackgroundImage(bgImage, resourceProvider);
        } else if (bgBrush.style() != Qt::NoBrush) {
            charFormat.setBackground(bgBrush);
            if (id == Html_hr)
                blockFormat.setProperty(QTextFormat::BackgroundBrush, bgBrush);
        }
    }
}